

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::
best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
::try_update(best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
             *this,local_context *ctx,bit_array *solution,double value,long loop)

{
  bool bVar1;
  size_t hash_00;
  double duration_00;
  double duration;
  time_point end;
  size_t hash;
  long loop_local;
  double value_local;
  bit_array *solution_local;
  local_context *ctx_local;
  best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
  *this_local;
  
  hash_00 = bit_array_hash::operator()((bit_array_hash *)((long)&end.__d.__r + 7),solution);
  bVar1 = storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>::
          can_be_inserted(&this->m_storage,hash_00,value);
  if (bVar1) {
    duration = (double)std::chrono::_V2::steady_clock::now();
    duration_00 = compute_duration<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                            (&this->m_start,
                             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&duration);
    storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::maximize_tag>::insert
              (&this->m_storage,ctx,solution,hash_00,value,duration_00,loop);
  }
  return;
}

Assistant:

void try_update(local_context& ctx,
                    const bit_array& solution,
                    const double value,
                    const long int loop)
    {
        auto hash = bit_array_hash()(solution);

        if (m_storage.can_be_inserted(hash, value)) {
            const auto end = std::chrono::steady_clock::now();
            const auto duration = compute_duration(m_start, end);

            m_storage.insert(ctx, solution, hash, value, duration, loop);
        }
    }